

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcRelDecomposes + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcRelDecomposes).field_0x0 + lVar2);
  *(undefined8 *)(&(this->super_IfcRelDecomposes).field_0x0 + lVar2) = 0x95f358;
  *(undefined8 *)(&(this->super_IfcRelDecomposes).field_0xd8 + lVar2) = 0x95f3d0;
  *(undefined8 *)(&(this->super_IfcRelDecomposes).field_0x88 + lVar2) = 0x95f380;
  *(undefined8 *)
   ((long)&(this->super_IfcRelDecomposes).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>._vptr_ObjectHelper +
   lVar2) = 0x95f3a8;
  pvVar3 = *(void **)(&(this->super_IfcRelDecomposes).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x18
                     + lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,puVar1[0x18] - (long)pvVar3);
  }
  *puVar1 = 0x95f470;
  puVar1[0x1b] = 0x95f498;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0xf0);
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}